

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

void __thiscall wasm::MultiMemoryLowering::Replacer::walkFunction(Replacer *this,Function *func)

{
  bool bVar1;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *pvVar2;
  reference pNVar3;
  undefined1 local_68 [8];
  Name funcName_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range2_1;
  Name funcName;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range2;
  Function *func_local;
  Replacer *this_local;
  
  pvVar2 = &this->parent->memorySizeNames;
  __end2 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin(pvVar2);
  funcName.super_IString.str._M_str =
       (char *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end(pvVar2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                                     *)&funcName.super_IString.str._M_str), bVar1) {
    pNVar3 = __gnu_cxx::
             __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
             ::operator*(&__end2);
    __range2_1 = (vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                 (pNVar3->super_IString).str._M_len;
    funcName.super_IString.str._M_len = (size_t)(pNVar3->super_IString).str._M_str;
    bVar1 = IString::operator==((IString *)&__range2_1,(IString *)func);
    if (bVar1) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
    operator++(&__end2);
  }
  pvVar2 = &this->parent->memoryGrowNames;
  __end2_1 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin(pvVar2);
  funcName_1.super_IString.str._M_str =
       (char *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end(pvVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                        *)&funcName_1.super_IString.str._M_str);
    if (!bVar1) {
      Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
      ::walkFunction(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
                      ).
                      super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                      .
                      super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                     ,func);
      return;
    }
    pNVar3 = __gnu_cxx::
             __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
             ::operator*(&__end2_1);
    local_68 = (undefined1  [8])(pNVar3->super_IString).str._M_len;
    funcName_1.super_IString.str._M_len = (size_t)(pNVar3->super_IString).str._M_str;
    bVar1 = IString::operator==((IString *)local_68,(IString *)func);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
    operator++(&__end2_1);
  }
  return;
}

Assistant:

void walkFunction(Function* func) {
      for (Name funcName : parent.memorySizeNames) {
        if (funcName == func->name) {
          return;
        }
      }
      for (Name funcName : parent.memoryGrowNames) {
        if (funcName == func->name) {
          return;
        }
      }
      Super::walkFunction(func);
    }